

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_to_binary_tree_inc.h
# Opt level: O0

void InitH10(MemoryManager *m,H10 *self,uint8_t *data,BrotliEncoderParams *params,size_t position,
            size_t bytes,int is_last)

{
  uint32_t uVar1;
  uint32_t *local_60;
  ulong local_58;
  uint local_4c;
  uint32_t i;
  size_t num_nodes;
  uint32_t invalid_pos;
  size_t bytes_local;
  size_t position_local;
  BrotliEncoderParams *params_local;
  uint8_t *data_local;
  H10 *self_local;
  MemoryManager *m_local;
  
  if (self->is_dirty_ != 0) {
    self->window_mask_ = (ulong)((1 << ((byte)params->lgwin & 0x1f)) - 1);
    uVar1 = -(int)self->window_mask_;
    self->invalid_pos_ = uVar1;
    for (local_4c = 0; local_4c < 0x20000; local_4c = local_4c + 1) {
      self->buckets_[local_4c] = uVar1;
    }
    if ((position != 0) || (local_58 = bytes, is_last == 0)) {
      local_58 = self->window_mask_ + 1;
    }
    if (self->forest_size_ < local_58) {
      BrotliFree(m,self->forest_);
      self->forest_ = (uint32_t *)0x0;
      if ((local_58 & 0x7fffffffffffffff) == 0) {
        local_60 = (uint32_t *)0x0;
      }
      else {
        local_60 = (uint32_t *)BrotliAllocate(m,local_58 << 3);
      }
      self->forest_ = local_60;
      self->forest_size_ = local_58;
    }
    self->is_dirty_ = 0;
  }
  return;
}

Assistant:

static void FN(Init)(
    MemoryManager* m, HashToBinaryTree* self, const uint8_t* data,
    const BrotliEncoderParams* params, size_t position, size_t bytes,
    BROTLI_BOOL is_last) {
  if (self->is_dirty_) {
    uint32_t invalid_pos;
    size_t num_nodes;
    uint32_t i;
    BROTLI_UNUSED(data);
    self->window_mask_ = (1u << params->lgwin) - 1u;
    invalid_pos = (uint32_t)(0 - self->window_mask_);
    self->invalid_pos_ = invalid_pos;
    for (i = 0; i < BUCKET_SIZE; i++) {
      self->buckets_[i] = invalid_pos;
    }
    num_nodes = (position == 0 && is_last) ? bytes : self->window_mask_ + 1;
    if (num_nodes > self->forest_size_) {
      BROTLI_FREE(m, self->forest_);
      self->forest_ = BROTLI_ALLOC(m, uint32_t, 2 * num_nodes);
      if (BROTLI_IS_OOM(m)) return;
      self->forest_size_ = num_nodes;
    }
    self->is_dirty_ = BROTLI_FALSE;
  }
}